

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRalgorithm.cpp
# Opt level: O2

void Rotate(Matrix *m,int i,Rotation *r)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  Vector lRow;
  Vector uRow;
  _Vector_base<double,_std::allocator<double>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  uVar5 = Matrix::GetCols(m);
  Matrix::GetRow((Vector *)&local_48,m,i);
  Matrix::GetRow((Vector *)&local_60,m,i + 1);
  uVar8 = 0;
  uVar7 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar7 = uVar8;
  }
  for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    dVar1 = r->c;
    dVar2 = r->s;
    dVar3 = local_48._M_impl.super__Vector_impl_data._M_start[uVar8];
    dVar4 = local_60._M_impl.super__Vector_impl_data._M_start[uVar8];
    pdVar6 = Matrix::operator()(m,i,(int)uVar8);
    *pdVar6 = dVar1 * dVar3 + dVar2 * dVar4;
    dVar1 = r->c;
    dVar2 = r->s;
    dVar3 = local_48._M_impl.super__Vector_impl_data._M_start[uVar8];
    dVar4 = local_60._M_impl.super__Vector_impl_data._M_start[uVar8];
    pdVar6 = Matrix::operator()(m,i + 1,(int)uVar8);
    *pdVar6 = dVar1 * dVar4 - dVar2 * dVar3;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void Rotate(Matrix &m, int i, const Rotation &r)
{
    const int n = m.GetCols();

    Vector uRow = m.GetRow(i);
    Vector lRow = m.GetRow(i + 1);

    for (int k = 0; k < n; k++)
    {
        m(i, k) = r.c * uRow[k] + r.s * lRow[k];
        m(i + 1, k) = -r.s * uRow[k] + r.c * lRow[k];
    }
}